

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_vec2 nk_layout_space_to_local(nk_context *ctx,nk_vec2 ret)

{
  nk_panel *pnVar1;
  nk_vec2 nVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x46b5,
                  "struct nk_vec2 nk_layout_space_to_local(struct nk_context *, struct nk_vec2)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar1 = ctx->current->layout;
    if (pnVar1 != (nk_panel *)0x0) {
      nVar2.y = ret.y + ((float)*pnVar1->offset_y - pnVar1->at_y);
      nVar2.x = ((float)*pnVar1->offset_x - pnVar1->at_x) + ret.x;
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x46b7,
                  "struct nk_vec2 nk_layout_space_to_local(struct nk_context *, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x46b6,
                "struct nk_vec2 nk_layout_space_to_local(struct nk_context *, struct nk_vec2)");
}

Assistant:

NK_API struct nk_vec2
nk_layout_space_to_local(struct nk_context *ctx, struct nk_vec2 ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += -layout->at_x + (float)*layout->offset_x;
    ret.y += -layout->at_y + (float)*layout->offset_y;
    return ret;
}